

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_MeshComponentRef * __thiscall ON_Mesh::MeshComponent(ON_Mesh *this,ON_COMPONENT_INDEX ci)

{
  bool bVar1;
  ON_MeshComponentRef *this_00;
  ON_MeshComponentRef cr;
  ON_COMPONENT_INDEX local_40;
  ON_MeshComponentRef local_38;
  ON_COMPONENT_INDEX local_18;
  
  local_40 = ci;
  MeshComponentRef(&local_38,this,ci);
  if (local_38.m_mesh == this) {
    local_18 = ON_MeshComponentRef::ComponentIndex(&local_38);
    bVar1 = ON_COMPONENT_INDEX::operator==(&local_18,&local_40);
    if (bVar1) {
      this_00 = (ON_MeshComponentRef *)operator_new(0x20);
      ON_Object::ON_Object((ON_Object *)this_00,(ON_Object *)&local_38);
      (this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object =
           (_func_int **)&PTR_ClassId_00813c58;
      this_00->m_mesh = local_38.m_mesh;
      this_00->m_mesh_ci = local_38.m_mesh_ci;
      goto LAB_0050f9da;
    }
  }
  this_00 = (ON_MeshComponentRef *)0x0;
LAB_0050f9da:
  ON_MeshComponentRef::~ON_MeshComponentRef(&local_38);
  return this_00;
}

Assistant:

ON_MeshComponentRef* ON_Mesh::MeshComponent( 
  ON_COMPONENT_INDEX ci
  ) const
{
  ON_MeshComponentRef* cr_ptr = 0;
  ON_MeshComponentRef cr = MeshComponentRef(ci);
  if ( this == cr.Mesh() && cr.ComponentIndex() == ci )
    cr_ptr = new ON_MeshComponentRef(cr);
  return cr_ptr;
}